

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::testInit(VaryingComponentsTest *this)

{
  testCase local_110;
  testCase local_108;
  testCase local_100;
  testCase local_f8;
  testCase local_f0;
  testCase local_e8;
  testCase local_e0;
  testCase local_d8;
  testCase local_d0;
  testCase local_c8;
  testCase local_c0;
  testCase local_b8;
  testCase local_b0;
  testCase local_a8;
  testCase local_a0;
  testCase local_98;
  testCase local_90;
  testCase local_88;
  testCase local_80;
  testCase local_78;
  testCase local_70;
  testCase local_68;
  testCase local_60;
  testCase local_58;
  testCase local_50;
  testCase local_48;
  testCase local_40;
  testCase local_38;
  testCase local_30;
  testCase local_28;
  testCase local_20;
  testCase local_18;
  VaryingComponentsTest *local_10;
  VaryingComponentsTest *this_local;
  
  local_10 = this;
  testCase::testCase(&local_18,GVEC4,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_18);
  testCase::testCase(&local_20,SCALAR_GVEC3,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_20);
  testCase::testCase(&local_28,GVEC3_SCALAR,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_28);
  testCase::testCase(&local_30,GVEC2_GVEC2,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_30);
  testCase::testCase(&local_38,GVEC2_SCALAR_SCALAR,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_38);
  testCase::testCase(&local_40,SCALAR_GVEC2_SCALAR,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_40);
  testCase::testCase(&local_48,SCALAR_SCALAR_GVEC2,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_48);
  testCase::testCase(&local_50,SCALAR_SCALAR_SCALAR_SCALAR,Double);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_50);
  testCase::testCase(&local_58,GVEC4,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_58);
  testCase::testCase(&local_60,SCALAR_GVEC3,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_60);
  testCase::testCase(&local_68,GVEC3_SCALAR,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_68);
  testCase::testCase(&local_70,GVEC2_GVEC2,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_70);
  testCase::testCase(&local_78,GVEC2_SCALAR_SCALAR,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_78);
  testCase::testCase(&local_80,SCALAR_GVEC2_SCALAR,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_80);
  testCase::testCase(&local_88,SCALAR_SCALAR_GVEC2,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_88);
  testCase::testCase(&local_90,SCALAR_SCALAR_SCALAR_SCALAR,Float);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_90);
  testCase::testCase(&local_98,GVEC4,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_98);
  testCase::testCase(&local_a0,SCALAR_GVEC3,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_a0);
  testCase::testCase(&local_a8,GVEC3_SCALAR,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_a8);
  testCase::testCase(&local_b0,GVEC2_GVEC2,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_b0);
  testCase::testCase(&local_b8,GVEC2_SCALAR_SCALAR,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_b8);
  testCase::testCase(&local_c0,SCALAR_GVEC2_SCALAR,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_c0);
  testCase::testCase(&local_c8,SCALAR_SCALAR_GVEC2,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_c8);
  testCase::testCase(&local_d0,SCALAR_SCALAR_SCALAR_SCALAR,Int);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_d0);
  testCase::testCase(&local_d8,GVEC4,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_d8);
  testCase::testCase(&local_e0,SCALAR_GVEC3,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_e0);
  testCase::testCase(&local_e8,GVEC3_SCALAR,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_e8);
  testCase::testCase(&local_f0,GVEC2_GVEC2,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_f0);
  testCase::testCase(&local_f8,GVEC2_SCALAR_SCALAR,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_f8);
  testCase::testCase(&local_100,SCALAR_GVEC2_SCALAR,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_100);
  testCase::testCase(&local_108,SCALAR_SCALAR_GVEC2,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_108);
  testCase::testCase(&local_110,SCALAR_SCALAR_SCALAR_SCALAR,Uint);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::push_back(&this->m_test_cases,&local_110);
  return;
}

Assistant:

void VaryingComponentsTest::testInit()
{
	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Double));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Float));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Int));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Uint));
}